

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diplodocus.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char local_2e8 [8];
  char hostname [128];
  undefined1 local_260 [8];
  BTCprov q;
  string fn;
  Conductor dipl;
  
  bzero(local_2e8,0x80);
  gethostname(local_2e8,0x80);
  std::__cxx11::string::string((string *)&q.field_0x200,*argv,(allocator *)local_260);
  std::__cxx11::string::_M_replace(0x142410,0,DAT_00142418,0x136020);
  diplo::onlyPartition = 0;
  diplo::nbOfClients = 1;
  std::__cxx11::string::_M_replace(0x142448,0,DAT_00142450,0x1378b7);
  std::__cxx11::string::_M_replace(0x142468,0,DAT_00142470,0x1378b7);
  diplo::pause_int = 0;
  diplo::maxScope = 0;
  diplo::minScope = 0;
  diplo::network_buf_size = 0x38;
  diplo::PartitionerRange = 1;
  diplo::ProvTrigerON = 0;
  std::__cxx11::string::_M_replace(0x142bc0,0,DAT_00142bc8,0x136025);
  std::__cxx11::string::_M_replace(0x142488,0,DAT_00142490,0x13602a);
  uVar2 = diplo::file_q_abi_cxx11_._8_8_;
  if (1 < argc) {
    pcVar1 = argv[1];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace(0x142be0,0,(char *)uVar2,(ulong)pcVar1);
    uVar2 = diplo::file_p_abi_cxx11_._8_8_;
    if (argc == 3) {
      pcVar1 = argv[2];
      strlen(pcVar1);
      std::__cxx11::string::_M_replace(0x142c00,0,(char *)uVar2,(ulong)pcVar1);
    }
  }
  gettimeofday((timeval *)&diplo::stopwatch,(__timezone_ptr_t)0x0);
  diplo::onlyPartition = 1;
  Conductor::Conductor((Conductor *)(fn.field_2._M_local_buf + 0xf));
  Conductor::LoadData((Conductor *)(fn.field_2._M_local_buf + 0xf));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading Time: ",0xe);
  gettimeofday((timeval *)local_260,(__timezone_ptr_t)0x0);
  poVar3 = std::ostream::_M_insert<double>
                     ((double)((long)q._vptr_BTCprov - DAT_00142db0) / 1000000.0 +
                      (double)((long)local_260 - diplo::stopwatch));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Memory: ",8);
  diplo::memory_usage_abi_cxx11_();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_260,(long)q._vptr_BTCprov);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_260 != (undefined1  [8])&q.provOutput) {
    operator_delete((void *)local_260);
  }
  queries::BTCprov::BTCprov((BTCprov *)local_260);
  if (diplo::file_q_abi_cxx11_._8_8_ != 0) {
    queries::BTCprov::TPDemo((BTCprov *)local_260);
  }
  queries::BTCprov::~BTCprov((BTCprov *)local_260);
  Conductor::~Conductor((Conductor *)(fn.field_2._M_local_buf + 0xf));
  if ((size_type *)q._512_8_ != &fn._M_string_length) {
    operator_delete((void *)q._512_8_);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    char hostname[128];
    bzero(hostname,128);
    gethostname(hostname, 128);

    string fn = argv[0];
    diplo::server_port = "9999";
    diplo::onlyPartition = false;
    diplo::nbOfClients = 1;
    diplo::moleculeconffile = "";
    diplo::dbDir = "";
    diplo::pause_int = 0;
    diplo::maxScope = 0;
    diplo::minScope = 0;
    diplo::network_buf_size = 56;
    diplo::PartitionerRange = 1;
    diplo::ProvTrigerON = false;
    statsDir="btc/";



     diplo::srcDir = "../dataset/";
				
				if (argc >= 2) diplo::file_q = argv[1];
				if (argc == 3) diplo::file_p = argv[2];
				
				
    diplo::stopwatch_start();
    diplo::onlyPartition = true;
    Conductor dipl;
    dipl.LoadData();



    cout << "Loading Time: " << diplo::stopwatch_get() << endl;
    cout << "Memory: " << diplo::memory_usage() << endl;

    queries::BTCprov q;

		if (!diplo::file_q.empty()) { 
			q.TPDemo();	
			return 0;
		}

}